

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerNewScArray(Lowerer *this,Instr *arrInstr)

{
  code *pcVar1;
  intptr_t arrayInfoAddr_00;
  intptr_t arrayInfo_00;
  intptr_t weakFuncRef_00;
  Instr *pIVar2;
  bool bVar3;
  uint32 length;
  JitProfilingInstr *arrInstr_00;
  undefined4 *puVar4;
  ProfiledInstr *pPVar5;
  JITTimeProfileInfo *pJVar6;
  IntConstOpnd *this_00;
  AddrOpnd *pAVar7;
  Opnd *pOVar8;
  bool local_69;
  Opnd *src1Opnd;
  intptr_t local_50;
  intptr_t arrayInfoAddr;
  ArrayCallSiteInfo *arrayInfo;
  intptr_t iStack_38;
  ProfileId profileId;
  intptr_t weakFuncRef;
  Lowerer *pLStack_28;
  JnHelperMethod helperMethod;
  Instr *instrPrev;
  Instr *arrInstr_local;
  Lowerer *this_local;
  
  instrPrev = arrInstr;
  arrInstr_local = (Instr *)this;
  bVar3 = IR::Instr::IsJitProfilingInstr(arrInstr);
  if (bVar3) {
    arrInstr_00 = IR::Instr::AsJitProfilingInstr(instrPrev);
    this_local = (Lowerer *)LowerProfiledNewScArray(this,arrInstr_00);
  }
  else {
    pLStack_28 = (Lowerer *)instrPrev->m_prev;
    weakFuncRef._4_4_ = HelperScrArr_OP_NewScArray;
    bVar3 = IR::Instr::IsProfiledInstr(instrPrev);
    if ((bVar3) && (bVar3 = Func::HasProfileInfo(instrPrev->m_func), bVar3)) {
      iStack_38 = Func::GetWeakFuncRef(instrPrev->m_func);
      if (iStack_38 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0xe34,"(weakFuncRef)","weakFuncRef");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pPVar5 = IR::Instr::AsProfiledInstr(instrPrev);
      arrayInfo._6_2_ = (pPVar5->u).field_3.fldInfoData.f1;
      pJVar6 = Func::GetReadOnlyProfileInfo(instrPrev->m_func);
      arrayInfoAddr = (intptr_t)JITTimeProfileInfo::GetArrayCallSiteInfo(pJVar6,arrayInfo._6_2_);
      pJVar6 = Func::GetReadOnlyProfileInfo(instrPrev->m_func);
      local_50 = JITTimeProfileInfo::GetArrayCallSiteInfoAddr(pJVar6,arrayInfo._6_2_);
      pOVar8 = IR::Instr::GetSrc1(instrPrev);
      bVar3 = IR::Opnd::IsConstOpnd(pOVar8);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0xe3a,"(arrInstr->GetSrc1()->IsConstOpnd())",
                           "arrInstr->GetSrc1()->IsConstOpnd()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pIVar2 = instrPrev;
      weakFuncRef_00 = iStack_38;
      arrayInfo_00 = arrayInfoAddr;
      arrayInfoAddr_00 = local_50;
      pOVar8 = IR::Instr::GetSrc1(instrPrev);
      this_00 = IR::Opnd::AsIntConstOpnd(pOVar8);
      length = IR::IntConstOpnd::AsUint32(this_00);
      GenerateProfiledNewScArrayFastPath
                (this,pIVar2,(ArrayCallSiteInfo *)arrayInfo_00,arrayInfoAddr_00,weakFuncRef_00,
                 length);
      pOVar8 = IR::Instr::GetDst(instrPrev);
      local_69 = false;
      if (pOVar8 != (Opnd *)0x0) {
        pOVar8 = IR::Instr::GetDst(instrPrev);
        src1Opnd._6_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(pOVar8);
        local_69 = ValueType::IsLikelyNativeArray((ValueType *)((long)&src1Opnd + 6));
      }
      pIVar2 = instrPrev;
      if (local_69 != false) {
        pAVar7 = IR::AddrOpnd::New(iStack_38,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,
                                   false,(Var)0x0);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,pIVar2,&pAVar7->super_Opnd);
        pIVar2 = instrPrev;
        pAVar7 = IR::AddrOpnd::New(local_50,AddrOpndKindDynamicArrayCallSiteInfo,this->m_func,false,
                                   (Var)0x0);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,pIVar2,&pAVar7->super_Opnd);
        weakFuncRef._4_4_ = HelperScrArr_ProfiledNewScArray;
      }
    }
    LoadScriptContext(this,instrPrev);
    pOVar8 = IR::Instr::UnlinkSrc1(instrPrev);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instrPrev,pOVar8);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,instrPrev,weakFuncRef._4_4_,(LabelInstr *)0x0,(Opnd *)0x0,
               (PropertySymOpnd *)0x0,false);
    this_local = pLStack_28;
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScArray(IR::Instr *arrInstr)
{
    if (arrInstr->IsJitProfilingInstr())
    {
        return LowerProfiledNewScArray(arrInstr->AsJitProfilingInstr());
    }

    IR::Instr *instrPrev = arrInstr->m_prev;
    IR::JnHelperMethod helperMethod = IR::HelperScrArr_OP_NewScArray;

    if (arrInstr->IsProfiledInstr() && arrInstr->m_func->HasProfileInfo())
    {
        intptr_t weakFuncRef = arrInstr->m_func->GetWeakFuncRef();
        Assert(weakFuncRef);

        Js::ProfileId profileId = static_cast<Js::ProfileId>(arrInstr->AsProfiledInstr()->u.profileId);
        Js::ArrayCallSiteInfo *arrayInfo = arrInstr->m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId);
        intptr_t arrayInfoAddr = arrInstr->m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfoAddr(profileId);

        Assert(arrInstr->GetSrc1()->IsConstOpnd());
        GenerateProfiledNewScArrayFastPath(arrInstr, arrayInfo, arrayInfoAddr, weakFuncRef, arrInstr->GetSrc1()->AsIntConstOpnd()->AsUint32());

        if (arrInstr->GetDst() && arrInstr->GetDst()->GetValueType().IsLikelyNativeArray())
        {
            m_lowererMD.LoadHelperArgument(arrInstr, IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func));
            m_lowererMD.LoadHelperArgument(arrInstr, IR::AddrOpnd::New(arrayInfoAddr, IR::AddrOpndKindDynamicArrayCallSiteInfo, m_func));
            helperMethod = IR::HelperScrArr_ProfiledNewScArray;
        }
    }

    LoadScriptContext(arrInstr);

    IR::Opnd *src1Opnd = arrInstr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(arrInstr, src1Opnd);
    m_lowererMD.ChangeToHelperCall(arrInstr, helperMethod);

    return instrPrev;
}